

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O3

bool Assimp::IFC::TryAddOpenings_Poly2Tri
               (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                *openings,vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *nors,
               TempMesh *curmesh)

{
  pointer *ppaVar1;
  double dVar2;
  pointer paVar3;
  element_type *peVar4;
  pointer puVar5;
  void *pvVar6;
  pointer pIVar7;
  double *pdVar8;
  iterator __position;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  CDT *this;
  pointer pvVar11;
  pointer pvVar12;
  pointer paVar13;
  pointer ppOVar14;
  bool bVar15;
  IntPoint *pIVar16;
  ulong uVar17;
  double *pdVar18;
  IntPoint *pIVar19;
  double *pdVar20;
  IntPoint *pIVar21;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range2;
  IfcVector3 *xx;
  pointer paVar22;
  pointer pTVar23;
  pointer pEVar24;
  pointer pvVar25;
  IfcVector2 *pip_1;
  pointer paVar26;
  pointer pIVar27;
  undefined1 (*pauVar28) [16];
  IfcVector2 *pip;
  IfcVector3 *x;
  pointer pTVar29;
  IntPoint *point;
  long lVar30;
  long lVar31;
  undefined8 uVar32;
  double dVar33;
  undefined1 auVar34 [16];
  IntPoint IVar35;
  undefined1 auVar36 [16];
  aiVector2t<double> aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour;
  Polygon hole;
  bool ok;
  aiVector3t<double> res_1;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  contours;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> contour_flat;
  IfcMatrix3 m;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> contour_points;
  Polygons holes_union;
  ExPolygons clipped;
  IfcVector3 nor;
  Clipper clipper_holes;
  aiVector3t<double> local_458 [2];
  IntPoint local_428;
  IntPoint *local_418;
  bool local_3f9;
  IntPoint local_3f8;
  double local_3e8;
  undefined4 local_3cc;
  CDT *local_3c8;
  undefined8 uStack_3c0;
  pointer local_3b8;
  pointer local_3b0;
  undefined1 local_3a8 [12];
  undefined4 uStack_39c;
  vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
  local_398;
  undefined1 local_378 [16];
  pointer local_368;
  pointer local_360;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> local_358;
  pointer local_338;
  pointer pTStack_330;
  CDT *local_328;
  CDT *pCStack_320;
  pointer local_318;
  pointer local_310;
  IfcMatrix3 local_308;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> local_2b8;
  Polygons local_298;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_278;
  undefined8 uStack_270;
  undefined1 local_268 [16];
  double local_258;
  double dStack_250;
  ExPolygons local_248;
  pointer local_228;
  undefined8 uStack_220;
  undefined1 (*local_218) [16];
  undefined1 (*pauStack_210) [16];
  undefined8 local_208;
  undefined8 uStack_200;
  pointer local_1f8;
  pointer local_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  IfcVector3 local_1c8;
  Clipper local_1a8;
  
  LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x540a6e);
  local_1c8.x = 0.0;
  local_1c8.y = 0.0;
  local_1c8.z = 0.0;
  DerivePlaneCoordinateSpace(&local_308,curmesh,&local_3f9,&local_1c8);
  if (local_3f9 == true) {
    dVar33 = local_308.b1 * -local_308.a2;
    dVar43 = -local_308.a3;
    local_258 = local_308.b2 * dVar43 * local_308.c1 +
                local_308.a3 * local_308.b1 * local_308.c2 +
                dVar33 * local_308.c3 +
                local_308.a2 * local_308.b3 * local_308.c1 +
                (local_308.a1 * local_308.b2 * local_308.c3 -
                local_308.b3 * local_308.a1 * local_308.c2);
    if ((local_258 != 0.0) || (NAN(local_258))) {
      local_258 = 1.0 / local_258;
      uStack_200 = -local_258;
      local_1e8 = (local_308.b1 * local_308.c3 - local_308.c1 * local_308.b3) * uStack_200;
      dStack_1e0 = (local_308.b2 * local_308.c3 - local_308.c2 * local_308.b3) * local_258;
      local_268._8_8_ = local_258 * (local_308.b3 * local_308.a2 + local_308.b2 * dVar43);
      local_268._0_8_ = uStack_200 * (local_308.b3 * local_308.a1 + dVar43 * local_308.b1);
      local_1d8 = (local_308.c3 * local_308.a1 + dVar43 * local_308.c1) * local_258;
      dStack_1d0 = (local_308.c3 * local_308.a2 + dVar43 * local_308.c2) * uStack_200;
      local_208 = (local_308.b1 * local_308.c2 + -local_308.b2 * local_308.c1) * local_258;
      uStack_200 = (local_308.a1 * local_308.c2 + -local_308.a2 * local_308.c1) * uStack_200;
      local_258 = (local_308.b2 * local_308.a1 + dVar33) * local_258;
      dStack_250 = local_308.b2;
    }
    else {
      local_258 = NAN;
      dStack_250 = 0.0;
      local_1e8 = NAN;
      dStack_1e0 = NAN;
      local_1d8 = NAN;
      dStack_1d0 = NAN;
      local_268._8_8_ = 0x7ff8000000000000;
      local_268._0_8_ = 0x7ff8000000000000;
      local_208 = NAN;
      uStack_200 = NAN;
    }
    local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (aiVector2t<double> *)0x0;
    local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (aiVector2t<double> *)0x0;
    local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (aiVector2t<double> *)0x0;
    std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::reserve
              (&local_358,
               ((long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(curmesh->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    paVar22 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar3 = (curmesh->mVerts).
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_3b8 = (pointer)nors;
    if (paVar22 == paVar3) {
      local_378._0_8_ = -10000000000.0;
      dVar33 = -10000000000.0;
      local_3a8._0_8_ = 10000000000.0;
      unique0x10000ddb = 10000000000.0;
      local_3c8 = (CDT *)0xbff0000000000000;
      uStack_3c0 = 0;
    }
    else {
      local_378._8_8_ = 0xc202a05f20000000;
      local_378._0_8_ = 0xc202a05f20000000;
      stack0xfffffffffffffc60 = 10000000000.0;
      local_3a8._0_8_ = 0x4202a05f20000000;
      do {
        local_228 = (pointer)paVar22->x;
        local_328 = (CDT *)paVar22->y;
        local_278 = (vector<unsigned_int,std::allocator<unsigned_int>> *)paVar22->z;
        local_338 = (pointer)local_308.c1;
        local_3b0 = (pointer)local_308.c2;
        local_3c8 = (CDT *)local_308.c3;
        uStack_3c0 = 0;
        pCStack_320 = (CDT *)0x0;
        uStack_220 = 0;
        uStack_270 = 0;
        local_218 = (undefined1 (*) [16])
                    ((double)local_278 * local_308.a3 +
                    (double)local_228 * local_308.a1 + local_308.a2 * (double)local_328);
        pauStack_210 = (undefined1 (*) [16])
                       ((double)local_278 * local_308.b3 +
                       (double)local_228 * local_308.b1 + local_308.b2 * (double)local_328);
        local_1a8._vptr_Clipper = (_func_int **)local_218;
        local_1a8.m_PolyOuts.
        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pauStack_210;
        if (local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)&local_358,
                     (iterator)
                     local_358.
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(aiVector2t<double> *)&local_1a8);
        }
        else {
          (local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->x = (double)local_218;
          (local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->y = (double)pauStack_210;
          local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_358.
               super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar41._8_8_ = pauStack_210;
        auVar41._0_8_ = local_218;
        _local_3a8 = minpd(_local_3a8,auVar41);
        local_378 = maxpd(local_378,auVar41);
        dVar33 = local_378._8_8_;
        paVar22 = paVar22 + 1;
      } while (paVar22 != paVar3);
      local_3c8 = (CDT *)((double)local_3c8 * (double)local_278 +
                         (double)local_338 * (double)local_228 +
                         (double)local_328 * (double)local_3b0);
    }
    pEVar24 = local_3b8;
    local_378._0_8_ = (double)local_378._0_8_ - (double)local_3a8._0_8_;
    local_218 = (undefined1 (*) [16])(dVar33 - register0x00001208);
    local_378._8_8_ = local_218;
    dVar33 = SQRT((double)local_378._0_8_ * (double)local_378._0_8_ +
                  (double)local_218 * (double)local_218);
    pauStack_210 = local_218;
    if ((dVar33 == 0.0) && (!NAN(dVar33))) {
      __assert_fail("vmax.Length()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCOpenings.cpp"
                    ,0x5dc,
                    "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                   );
    }
    local_248.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_248.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_248.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ClipperLib::Clipper::Clipper(&local_1a8);
    pTVar29 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pTVar23 = (openings->
              super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar29 != pTVar23) {
      local_328 = local_3c8;
      pCStack_320 = local_3c8;
      lVar30 = 0;
      local_338 = pTVar23;
      do {
        paVar22 = (((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   &pEVar24->outer)->_M_impl).super__Vector_impl_data._M_start;
        if ((0.9999989867210388 <=
             ABS(local_1c8.z * paVar22[lVar30].z +
                 local_1c8.x * paVar22[lVar30].x + local_1c8.y * paVar22[lVar30].y)) &&
           (peVar4 = (pTVar29->profileMesh).
                     super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           2 < (ulong)(((long)(peVar4->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar4->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
           )) {
          local_458[0].x = 0.0;
          local_458[0].y = 0.0;
          local_458[0].z = 0.0;
          paVar22 = (peVar4->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar3 = (peVar4->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (paVar22 == paVar3) {
            local_428 = (IntPoint)ZEXT816(0);
            local_418 = (IntPoint *)0x0;
          }
          else {
            do {
              dVar33 = paVar22->x;
              dVar43 = paVar22->y;
              dVar2 = paVar22->z;
              dVar44 = dVar2 * local_308.b3 + dVar33 * local_308.b1 + dVar43 * local_308.b2;
              local_428.Y._0_4_ = SUB84(dVar44,0);
              local_428.X = (long64)(dVar2 * local_308.a3 +
                                    dVar33 * local_308.a1 + dVar43 * local_308.a2);
              local_428.Y._4_4_ = (int)((ulong)dVar44 >> 0x20);
              dVar44 = (pTVar29->extrusionDir).x + dVar33;
              dVar45 = (pTVar29->extrusionDir).y + dVar43;
              dVar46 = (pTVar29->extrusionDir).z + dVar2;
              local_3f8.X = (long64)(dVar46 * local_308.a3 +
                                    dVar44 * local_308.a1 + dVar45 * local_308.a2);
              local_3f8.Y = (long64)(dVar46 * local_308.b3 +
                                    dVar44 * local_308.b1 + dVar45 * local_308.b2);
              local_418 = (IntPoint *)
                          (local_308.c3 * dVar2 + local_308.c1 * dVar33 + local_308.c2 * dVar43);
              local_3e8 = local_308.c3 * dVar46 + local_308.c1 * dVar44 + local_308.c2 * dVar45;
              pIVar16 = &local_428;
              if (ABS(local_3e8 - (double)pCStack_320) < ABS((double)local_418 - (double)local_328))
              {
                pIVar16 = &local_3f8;
              }
              local_398.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(((_Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                               *)&pIVar16->X)->_M_impl).super__Vector_impl_data._M_start;
              local_398.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar16->Y;
              local_428 = *pIVar16;
              local_418 = (IntPoint *)pIVar16[1].X;
              if (local_458[0].y == local_458[0].z) {
                std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
                _M_realloc_insert<aiVector2t<double>>
                          ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)
                           local_458,(iterator)local_458[0].y,(aiVector2t<double> *)&local_398);
              }
              else {
                *(double *)local_458[0].y =
                     (double)local_398.
                             super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                *(pointer *)((long)local_458[0].y + 8) =
                     local_398.
                     super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_458[0].y = (double)((long)local_458[0].y + 0x10);
              }
              dVar33 = local_458[0].y;
              paVar22 = paVar22 + 1;
            } while (paVar22 != paVar3);
            local_428 = (IntPoint)ZEXT816(0);
            local_418 = (IntPoint *)0x0;
            for (pIVar16 = (IntPoint *)local_458[0].x; pIVar16 != (IntPoint *)dVar33;
                pIVar16 = pIVar16 + 1) {
              auVar34._0_8_ = (double)pIVar16->X - (double)local_3a8._0_8_;
              auVar34._8_8_ = (double)pIVar16->Y - stack0xfffffffffffffc60;
              IVar35 = (IntPoint)divpd(auVar34,local_378);
              dVar43 = (double)IVar35.X * 1518500249.0;
              uVar17 = (ulong)dVar43;
              *pIVar16 = IVar35;
              local_3f8.X = (long)(dVar43 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
              dVar43 = (double)IVar35.Y * 1518500249.0;
              uVar17 = (ulong)dVar43;
              local_3f8.Y = (long)(dVar43 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
              if ((IntPoint *)local_428.Y == local_418) {
                std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
                _M_realloc_insert<ClipperLib::IntPoint>
                          ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                           &local_428,(iterator)local_428.Y,&local_3f8);
              }
              else {
                *(long64 *)local_428.Y = local_3f8.X;
                *(long64 *)(local_428.Y + 8) = local_3f8.Y;
                local_428.Y = (long64)(local_428.Y + 0x10);
              }
            }
          }
          bVar15 = ClipperLib::Orientation((Polygon *)&local_428);
          pTVar23 = local_338;
          pEVar24 = local_3b8;
          if (!bVar15) {
            pdVar20 = (double *)(local_428.Y + -0x10);
            pdVar8 = (double *)local_428.X;
            if ((ulong)local_428.X < pdVar20 && local_428.X != local_428.Y) {
              do {
                pdVar18 = pdVar8 + 2;
                local_3f8.X = (long64)*pdVar8;
                local_3f8.Y = (long64)pdVar8[1];
                dVar33 = pdVar20[1];
                *pdVar8 = *pdVar20;
                pdVar8[1] = dVar33;
                *pdVar20 = (double)local_3f8.X;
                pdVar20[1] = (double)local_3f8.Y;
                pdVar20 = pdVar20 + -2;
                pdVar8 = pdVar18;
              } while (pdVar18 < pdVar20);
            }
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)
                     ((long)&local_1a8._vptr_Clipper +
                     *(long *)(*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + -0x20) + 8)),
                     (Polygon *)&local_428,ptSubject);
          if ((void *)local_428.X != (void *)0x0) {
            operator_delete((void *)local_428.X,(long)local_418 - local_428.X);
          }
          if ((IntPoint *)local_458[0].x != (IntPoint *)0x0) {
            operator_delete((void *)local_458[0].x,(long)local_458[0].z - (long)local_458[0].x);
          }
        }
        lVar30 = lVar30 + 1;
        pTVar29 = pTVar29 + 1;
      } while (pTVar29 != pTVar23);
    }
    ClipperLib::Clipper::Execute(&local_1a8,ctUnion,&local_298,pftNonZero,pftNonZero);
    paVar13 = local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_298.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_298.
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ClipperLib::Clipper::~Clipper(&local_1a8);
      bVar15 = false;
    }
    else {
      local_458[0].x = 0.0;
      local_458[0].y = 0.0;
      local_458[0].z = 0.0;
      if (local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar26 = local_358.
                  super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          auVar36._0_8_ = paVar26->x - (double)local_3a8._0_8_;
          auVar36._8_8_ = paVar26->y - stack0xfffffffffffffc60;
          aVar37 = (aiVector2t<double>)divpd(auVar36,local_378);
          dVar33 = aVar37.x * 1518500249.0;
          uVar17 = (ulong)dVar33;
          *paVar26 = aVar37;
          local_428.X = (long)(dVar33 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
          dVar33 = aVar37.y * 1518500249.0;
          uVar17 = (ulong)dVar33;
          local_428.Y = (long)(dVar33 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
          if (local_458[0].y == local_458[0].z) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            _M_realloc_insert<ClipperLib::IntPoint>
                      ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                       local_458,(iterator)local_458[0].y,&local_428);
          }
          else {
            *(long64 *)local_458[0].y = local_428.X;
            *(long64 *)((long)local_458[0].y + 8) = local_428.Y;
            local_458[0].y = (double)((long)local_458[0].y + 0x10);
          }
          paVar26 = paVar26 + 1;
        } while (paVar26 != paVar13);
      }
      bVar15 = ClipperLib::Orientation((Polygon *)local_458);
      if ((bVar15) &&
         (pIVar21 = (IntPoint *)((long)local_458[0].y + -0x10), pIVar16 = (IntPoint *)local_458[0].x
         , (ulong)local_458[0].x < pIVar21 && local_458[0].x != local_458[0].y)) {
        do {
          pIVar19 = pIVar16 + 1;
          dVar33 = (double)pIVar16->X;
          dVar43 = (double)pIVar16->Y;
          local_428 = *pIVar16;
          dVar2 = (double)pIVar21->Y;
          pIVar16->X = pIVar21->X;
          pIVar16->Y = (long64)dVar2;
          pIVar21->X = (long64)dVar33;
          pIVar21->Y = (long64)dVar43;
          pIVar21 = pIVar21 + -1;
          pIVar16 = pIVar19;
        } while (pIVar19 < pIVar21);
      }
      ClipperLib::Clipper::Clear(&local_1a8);
      ClipperLib::ClipperBase::AddPolygon
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 *(long *)(*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + -0x20) + 8)),
                 (Polygon *)local_458,ptSubject);
      ClipperLib::ClipperBase::AddPolygons
                ((ClipperBase *)
                 ((long)&local_1a8._vptr_Clipper +
                 *(long *)(*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + -0x20) + 8)),
                 &local_298,ptClip);
      ClipperLib::Clipper::Execute(&local_1a8,ctDifference,&local_248,pftNonZero,pftNonZero);
      if ((IntPoint *)local_458[0].x != (IntPoint *)0x0) {
        operator_delete((void *)local_458[0].x,(long)local_458[0].z - (long)local_458[0].x);
      }
      ClipperLib::Clipper::~Clipper(&local_1a8);
      local_360 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      paVar22 = (curmesh->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish;
      local_310 = (curmesh->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_278 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&curmesh->mVertcnt;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_368 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar5 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_318 = (curmesh->mVertcnt).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_398.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_398.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.
      super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3b8 = local_248.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (local_248.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_248.
          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                  ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)curmesh,
                   (curmesh->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_360,paVar22);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  (local_278,
                   (curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_368,puVar5);
        LogFunctions<Assimp::IFCImporter>::LogError((char *)0x541d7d);
        bVar15 = false;
      }
      else {
        local_268._0_8_ = (double)local_268._0_8_ * (double)local_3c8;
        local_268._8_8_ = (double)local_268._8_8_ * (double)local_3c8;
        auVar9._4_8_ = local_3c8;
        auVar9._0_4_ = local_3a8._4_4_;
        auVar38._0_8_ = auVar9._0_8_ << 0x20;
        auVar38._8_4_ = local_3a8._8_4_;
        auVar38._12_4_ = uStack_39c;
        local_328 = auVar38._8_8_;
        auVar10._4_8_ = local_328;
        auVar10._0_4_ = local_208._4_4_;
        auVar39._0_8_ = auVar10._0_8_ << 0x20;
        auVar39._8_4_ = (undefined4)uStack_200;
        auVar39._12_4_ = uStack_200._4_4_;
        local_338 = auVar39._8_8_;
        uVar32 = 0;
        local_258 = local_258 * (double)local_3c8;
        pEVar24 = local_248.
                  super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTStack_330 = local_338;
        pCStack_320 = local_328;
        local_1f8 = paVar22;
        local_1f0 = puVar5;
        do {
          pvVar12 = local_398.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pvVar11 = local_398.
                    super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_3cc = (undefined4)uVar32;
          pIVar27 = (pointer)local_398.
                             super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          if (local_398.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_398.
              super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pvVar6 = (void *)pIVar27->X;
              if (pvVar6 != (void *)0x0) {
                operator_delete(pvVar6,pIVar27[1].X - (long)pvVar6);
              }
              pIVar7 = pIVar27 + 1;
              pIVar27 = (pointer)&pIVar7->Y;
            } while ((pointer)&pIVar7->Y != pvVar12);
            local_398.
            super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar11;
          }
          local_2b8.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2b8.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2b8.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          paVar3 = (((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                    &pEVar24->outer)->_M_impl).super__Vector_impl_data._M_finish;
          for (paVar22 = (((_Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                           )&pEVar24->outer)->_M_impl).super__Vector_impl_data._M_start;
              paVar22 != paVar3; paVar22 = (pointer)&paVar22->z) {
            local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
            auVar40._0_8_ = (double)(long)paVar22->x;
            auVar40._8_8_ = (double)(long)paVar22->y;
            auVar41 = divpd(auVar40,_DAT_006c6b60);
            *(undefined1 (*) [16])local_1a8._vptr_Clipper = auVar41;
            *(undefined8 *)*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + 0x10) = 0;
            *(undefined8 *)(*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + 0x10) + 8) = 0;
            *(undefined8 *)*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + 0x20) = 0;
            std::vector<p2t::Point*,std::allocator<p2t::Point*>>::emplace_back<p2t::Point*>
                      ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)&local_2b8,
                       (Point **)&local_1a8);
          }
          local_3c8 = (CDT *)operator_new(0x10);
          p2t::CDT::CDT(local_3c8,&local_2b8);
          pvVar25 = (pEVar24->holes).
                    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_228 = (pEVar24->holes).
                      super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_3b0 = pEVar24;
          if (pvVar25 != local_228) {
            do {
              local_1a8._vptr_Clipper = (_func_int **)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::
              vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
              ::emplace_back<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>
                        ((vector<std::vector<p2t::Point*,std::allocator<p2t::Point*>>,std::allocator<std::vector<p2t::Point*,std::allocator<p2t::Point*>>>>
                          *)&local_398,
                         (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)&local_1a8);
              if ((undefined1 (*) [16])local_1a8._vptr_Clipper != (undefined1 (*) [16])0x0) {
                operator_delete(local_1a8._vptr_Clipper,
                                (long)local_1a8.m_PolyOuts.
                                      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1a8._vptr_Clipper);
              }
              paVar22 = (pointer)&((pointer)
                                  ((long)local_398.
                                         super__Vector_base<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -0x20))->Y;
              pIVar7 = (pvVar25->
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pIVar27 = (pvVar25->
                             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                             )._M_impl.super__Vector_impl_data._M_start; pIVar27 != pIVar7;
                  pIVar27 = pIVar27 + 1) {
                local_1a8._vptr_Clipper = (_func_int **)operator_new(0x28);
                auVar42._0_8_ = (double)pIVar27->X;
                auVar42._8_8_ = (double)pIVar27->Y;
                auVar41 = divpd(auVar42,_DAT_006c6b60);
                *(undefined1 (*) [16])local_1a8._vptr_Clipper = auVar41;
                *(undefined8 *)*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + 0x10) = 0;
                *(undefined8 *)(*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + 0x10) + 8) =
                     0;
                *(undefined8 *)*(undefined1 (*) [16])((long)local_1a8._vptr_Clipper + 0x20) = 0;
                std::vector<p2t::Point*,std::allocator<p2t::Point*>>::emplace_back<p2t::Point*>
                          ((vector<p2t::Point*,std::allocator<p2t::Point*>> *)paVar22,
                           (Point **)&local_1a8);
              }
              p2t::CDT::AddHole(local_3c8,
                                (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)paVar22);
              pvVar25 = pvVar25 + 1;
            } while (pvVar25 != local_228);
          }
          this = local_3c8;
          p2t::CDT::Triangulate(local_3c8);
          p2t::CDT::GetTriangles
                    ((vector<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_> *)&local_1a8,this);
          ppOVar14 = local_1a8.m_PolyOuts.
                     super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pauVar28 = (undefined1 (*) [16])local_1a8._vptr_Clipper;
          if ((pointer)local_1a8._vptr_Clipper !=
              local_1a8.m_PolyOuts.
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            do {
              lVar30 = *(long *)*pauVar28;
              lVar31 = 1;
              do {
                pdVar8 = *(double **)(lVar30 + lVar31 * 8);
                dVar33 = *pdVar8;
                if ((((1.0 < dVar33) || (dVar33 < 0.0)) || (dVar43 = pdVar8[1], 1.0 < dVar43)) ||
                   (dVar43 < 0.0)) {
                  __assert_fail("v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCOpenings.cpp"
                                ,0x68a,
                                "bool Assimp::IFC::TryAddOpenings_Poly2Tri(const std::vector<TempOpening> &, const std::vector<IfcVector3> &, TempMesh &)"
                               );
                }
                dVar33 = dVar33 * (double)local_378._0_8_ + (double)local_3a8._0_8_;
                dVar43 = dVar43 * (double)local_218 + (double)local_328;
                local_458[0].y = dVar33 * local_1e8 + dVar43 * local_1d8 + (double)local_268._0_8_;
                local_458[0].x = dVar33 * dStack_1e0 + dVar43 * dStack_1d0 + (double)local_268._8_8_
                ;
                local_458[0].z = local_208 * dVar33 + (double)local_338 * dVar43 + local_258;
                __position._M_current =
                     (curmesh->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (curmesh->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                  _M_realloc_insert<aiVector3t<double>const&>
                            ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                             curmesh,__position,local_458);
                }
                else {
                  (__position._M_current)->z = local_458[0].z;
                  (__position._M_current)->x = local_458[0].x;
                  (__position._M_current)->y = local_458[0].y;
                  ppaVar1 = &(curmesh->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar1 = *ppaVar1 + 1;
                }
                lVar31 = lVar31 + 1;
              } while (lVar31 != 4);
              local_458[0].x = (double)CONCAT44(local_458[0].x._4_4_,3);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_278,
                         (uint *)local_458);
              pauVar28 = (undefined1 (*) [16])((long)*pauVar28 + 8);
            } while (pauVar28 != (undefined1 (*) [16])ppOVar14);
            paVar22 = (pointer)0x0;
          }
          if ((undefined1 (*) [16])local_1a8._vptr_Clipper != (undefined1 (*) [16])0x0) {
            operator_delete(local_1a8._vptr_Clipper,
                            (long)local_1a8.m_PolyOuts.
                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1a8._vptr_Clipper);
          }
          pEVar24 = local_3b0;
          uVar32 = CONCAT71((int7)((ulong)paVar22 >> 8),1);
          if (local_2b8.super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b8.
                            super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_2b8.
                                  super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b8.
                                  super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pEVar24 = pEVar24 + 1;
        } while (pEVar24 != local_3b8);
        bVar15 = true;
      }
      std::
      vector<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>,_std::allocator<std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>_>
      ::~vector(&local_398);
      if (local_368 != (pointer)0x0) {
        operator_delete(local_368,(long)local_318 - (long)local_368);
      }
      if (local_360 != (pointer)0x0) {
        operator_delete(local_360,(long)local_310 - (long)local_360);
      }
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&local_298);
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&local_248);
    if (local_358.super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (aiVector2t<double> *)0x0) {
      operator_delete(local_358.
                      super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_358.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_358.
                            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool TryAddOpenings_Poly2Tri(const std::vector<TempOpening>& openings,const std::vector<IfcVector3>& nors,
    TempMesh& curmesh)
{
    IFCImporter::LogWarn("forced to use poly2tri fallback method to generate wall openings");
    std::vector<IfcVector3>& out = curmesh.mVerts;

    bool result = false;

    // Try to derive a solid base plane within the current surface for use as
    // working coordinate system.
    bool ok;
    IfcVector3 nor;
    const IfcMatrix3 m = DerivePlaneCoordinateSpace(curmesh, ok, nor);
    if (!ok) {
        return false;
    }

    const IfcMatrix3 minv = IfcMatrix3(m).Inverse();


    IfcFloat coord = -1;

    std::vector<IfcVector2> contour_flat;
    contour_flat.reserve(out.size());

    IfcVector2 vmin, vmax;
    MinMaxChooser<IfcVector2>()(vmin, vmax);

    // Move all points into the new coordinate system, collecting min/max verts on the way
    for(IfcVector3& x : out) {
        const IfcVector3 vv = m * x;

        // keep Z offset in the plane coordinate system. Ignoring precision issues
        // (which  are present, of course), this should be the same value for
        // all polygon vertices (assuming the polygon is planar).


        // XXX this should be guarded, but we somehow need to pick a suitable
        // epsilon
        // if(coord != -1.0f) {
        //  assert(std::fabs(coord - vv.z) < 1e-3f);
        // }

        coord = vv.z;

        vmin = std::min(IfcVector2(vv.x, vv.y), vmin);
        vmax = std::max(IfcVector2(vv.x, vv.y), vmax);

        contour_flat.push_back(IfcVector2(vv.x,vv.y));
    }

    // With the current code in DerivePlaneCoordinateSpace,
    // vmin,vmax should always be the 0...1 rectangle (+- numeric inaccuracies)
    // but here we won't rely on this.

    vmax -= vmin;

    // If this happens then the projection must have been wrong.
    ai_assert(vmax.Length());

    ClipperLib::ExPolygons clipped;
    ClipperLib::Polygons holes_union;


    IfcVector3 wall_extrusion;
    bool first = true;

    try {

        ClipperLib::Clipper clipper_holes;
        size_t c = 0;

        for(const TempOpening& t :openings) {
            const IfcVector3& outernor = nors[c++];
            const IfcFloat dot = nor * outernor;
            if (std::fabs(dot)<1.f-1e-6f) {
                continue;
            }

            const std::vector<IfcVector3>& va = t.profileMesh->mVerts;
            if(va.size() <= 2) {
                continue;
            }

            std::vector<IfcVector2> contour;

            for(const IfcVector3& xx : t.profileMesh->mVerts) {
                IfcVector3 vv = m *  xx, vv_extr = m * (xx + t.extrusionDir);

                const bool is_extruded_side = std::fabs(vv.z - coord) > std::fabs(vv_extr.z - coord);
                if (first) {
                    first = false;
                    if (dot > 0.f) {
                        wall_extrusion = t.extrusionDir;
                        if (is_extruded_side) {
                            wall_extrusion = - wall_extrusion;
                        }
                    }
                }

                // XXX should not be necessary - but it is. Why? For precision reasons?
                vv = is_extruded_side ? vv_extr : vv;
                contour.push_back(IfcVector2(vv.x,vv.y));
            }

            ClipperLib::Polygon hole;
            for(IfcVector2& pip : contour) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                hole.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            }

            if (!ClipperLib::Orientation(hole)) {
                std::reverse(hole.begin(), hole.end());
            //  assert(ClipperLib::Orientation(hole));
            }

            /*ClipperLib::Polygons pol_temp(1), pol_temp2(1);
            pol_temp[0] = hole;

            ClipperLib::OffsetPolygons(pol_temp,pol_temp2,5.0);
            hole = pol_temp2[0];*/

            clipper_holes.AddPolygon(hole,ClipperLib::ptSubject);
        }

        clipper_holes.Execute(ClipperLib::ctUnion,holes_union,
            ClipperLib::pftNonZero,
            ClipperLib::pftNonZero);

        if (holes_union.empty()) {
            return false;
        }

        // Now that we have the big union of all holes, subtract it from the outer contour
        // to obtain the final polygon to feed into the triangulator.
        {
            ClipperLib::Polygon poly;
            for(IfcVector2& pip : contour_flat) {
                pip.x  = (pip.x - vmin.x) / vmax.x;
                pip.y  = (pip.y - vmin.y) / vmax.y;

                poly.push_back(ClipperLib::IntPoint( to_int64(pip.x), to_int64(pip.y) ));
            }

            if (ClipperLib::Orientation(poly)) {
                std::reverse(poly.begin(), poly.end());
            }
            clipper_holes.Clear();
            clipper_holes.AddPolygon(poly,ClipperLib::ptSubject);

            clipper_holes.AddPolygons(holes_union,ClipperLib::ptClip);
            clipper_holes.Execute(ClipperLib::ctDifference,clipped,
                ClipperLib::pftNonZero,
                ClipperLib::pftNonZero);
        }

    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, skipping openings for this face: (Clipper: "
            + std::string(sx) + ")");

        return false;
    }

    std::vector<IfcVector3> old_verts;
    std::vector<unsigned int> old_vertcnt;

    old_verts.swap(curmesh.mVerts);
    old_vertcnt.swap(curmesh.mVertcnt);

    std::vector< std::vector<p2t::Point*> > contours;
    for(ClipperLib::ExPolygon& clip : clipped) {

        contours.clear();

        // Build the outer polygon contour line for feeding into poly2tri
        std::vector<p2t::Point*> contour_points;
        for(ClipperLib::IntPoint& point : clip.outer) {
            contour_points.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
        }

        p2t::CDT* cdt ;
        try {
            // Note: this relies on custom modifications in poly2tri to raise runtime_error's
            // instead if assertions. These failures are not debug only, they can actually
            // happen in production use if the input data is broken. An assertion would be
            // inappropriate.
            cdt = new p2t::CDT(contour_points);
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }


        // Build the poly2tri inner contours for all holes we got from ClipperLib
        for(ClipperLib::Polygon& opening : clip.holes) {

            contours.push_back(std::vector<p2t::Point*>());
            std::vector<p2t::Point*>& contour = contours.back();

            for(ClipperLib::IntPoint& point : opening) {
                contour.push_back( new p2t::Point(from_int64(point.X), from_int64(point.Y)) );
            }

            cdt->AddHole(contour);
        }

        try {
            // Note: See above
            cdt->Triangulate();
        }
        catch(const std::exception& e) {
            IFCImporter::LogError("Ifc: error during polygon triangulation, skipping some openings: (poly2tri: "
                + std::string(e.what()) + ")");
            continue;
        }

        const std::vector<p2t::Triangle*> tris = cdt->GetTriangles();

        // Collect the triangles we just produced
        for(p2t::Triangle* tri : tris) {
            for(int i = 0; i < 3; ++i) {

                const IfcVector2 v = IfcVector2(
                    static_cast<IfcFloat>( tri->GetPoint(i)->x ),
                    static_cast<IfcFloat>( tri->GetPoint(i)->y )
                );

                ai_assert(v.x <= 1.0 && v.x >= 0.0 && v.y <= 1.0 && v.y >= 0.0);
                const IfcVector3 v3 = minv * IfcVector3(vmin.x + v.x * vmax.x, vmin.y + v.y * vmax.y,coord) ;

                curmesh.mVerts.push_back(v3);
            }
            curmesh.mVertcnt.push_back(3);
        }

        result = true;
    }

    if (!result) {
        // revert -- it's a shame, but better than nothing
        curmesh.mVerts.insert(curmesh.mVerts.end(),old_verts.begin(), old_verts.end());
        curmesh.mVertcnt.insert(curmesh.mVertcnt.end(),old_vertcnt.begin(), old_vertcnt.end());

        IFCImporter::LogError("Ifc: revert, could not generate openings for this wall");
    }

    return result;
}